

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O2

int ngp_read_xtension(fitsfile *ff,int parent_hn,int simple_mode)

{
  NGP_TOKEN *pNVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  char *__s2;
  ulong __n;
  long lVar7;
  int local_2010;
  int local_200c;
  fitsfile *local_2008;
  char ngph_ctmp;
  NGP_HDU ngph;
  int local_1fe4;
  int j;
  int tmp0;
  char *local_1fd0;
  int my_version;
  int my_hn;
  long lv;
  char incrementor_name [80];
  long ngph_size [999];
  
  ngph.tok = (NGP_TOKEN *)0x0;
  incrementor_name[0] = '\0';
  ngph.tokcnt = 0;
  iVar2 = ngp_read_line(0);
  if (iVar2 == 0) {
    if ((simple_mode & 1U) == 0) {
      if (ngp_keyidx != 3) {
        return 0x171;
      }
    }
    else if (ngp_keyidx != 4) {
      return 0x171;
    }
    iVar2 = ngp_hdu_insert_token(&ngph,&ngp_linkey);
    if (iVar2 == 0) {
      local_200c = 0;
      while( true ) {
        local_2010 = ngp_read_line(0);
        if (local_2010 != 0) {
          return local_2010;
        }
        if (ngp_keyidx - 1U < 3) break;
        iVar2 = 0;
        if (ngp_keyidx == 5) goto LAB_0017028a;
        if (ngp_keyidx == 4) {
          local_2010 = 0x171;
          goto LAB_0017067d;
        }
        sVar4 = strlen(ngp_linkey.name);
        iVar2 = (int)sVar4;
        if (iVar2 - 2U < 5) {
          __n = (ulong)(iVar2 - 1U);
          if (ngp_linkey.name[__n] == '#') {
            if (incrementor_name[0] == '\0') {
              memcpy(incrementor_name,ngp_linkey.name,__n);
              incrementor_name[__n] = '\0';
            }
            sVar5 = strlen(incrementor_name);
            if (iVar2 - 1U == (uint)sVar5) {
              iVar3 = bcmp(incrementor_name,ngp_linkey.name,__n);
              local_200c = local_200c + (uint)(iVar3 == 0);
            }
            snprintf(ngp_linkey.name + ((sVar4 & 0xffffffff) - 1),(ulong)(0x4c - iVar2),"%d");
          }
        }
        local_2010 = ngp_hdu_insert_token(&ngph,&ngp_linkey);
        if (local_2010 != 0) goto LAB_0017067d;
      }
      local_2010 = ngp_unread_line();
      iVar2 = local_2010;
      if (local_2010 != 0) goto LAB_0017067d;
LAB_0017028a:
      local_2010 = iVar2;
      for (lVar6 = 0; lVar6 != 999; lVar6 = lVar6 + 1) {
        ngph_size[lVar6] = 0;
      }
      lVar6 = 0x50;
      local_1fe4 = 0;
      local_200c = 0;
      iVar2 = 0;
      local_1fd0 = (char *)0x0;
      local_2008 = ff;
      for (lVar7 = 0; pNVar1 = ngph.tok, ff = local_2008, lVar7 < ngph.tokcnt; lVar7 = lVar7 + 1) {
        __s2 = (ngph.tok)->name + lVar6 + -0x50;
        iVar3 = strcmp("XTENSION",__s2);
        if (iVar3 == 0) {
          if (*(int *)(pNVar1->name + lVar6 + -0x54) == 2) {
            iVar3 = fits_strncasecmp("BINTABLE",*(char **)(pNVar1->name + lVar6 + -4),8);
            if (iVar3 == 0) {
              iVar2 = 3;
            }
            iVar3 = fits_strncasecmp("TABLE",*(char **)((ngph.tok)->name + lVar6 + -4),5);
            if (iVar3 == 0) {
              iVar2 = 2;
            }
            iVar3 = fits_strncasecmp("IMAGE",*(char **)((ngph.tok)->name + lVar6 + -4),5);
            if (iVar3 == 0) {
              iVar2 = 1;
            }
          }
        }
        else {
          iVar3 = strcmp("SIMPLE",__s2);
          if (iVar3 == 0) {
            if ((*(int *)(pNVar1->name + lVar6 + -0x54) == 1) && (pNVar1->name[lVar6 + -4] != '\0'))
            {
              iVar2 = 1;
            }
          }
          else {
            iVar3 = strcmp("BITPIX",__s2);
            if (iVar3 == 0) {
              if (*(int *)(pNVar1->name + lVar6 + -0x54) == 3) {
                local_200c = *(int *)(pNVar1->name + lVar6 + -4);
              }
            }
            else {
              iVar3 = strcmp("NAXIS",__s2);
              if (iVar3 == 0) {
                if (*(int *)(pNVar1->name + lVar6 + -0x54) == 3) {
                  local_1fe4 = *(int *)(pNVar1->name + lVar6 + -4);
                }
              }
              else {
                iVar3 = strcmp("EXTNAME",__s2);
                if (iVar3 == 0) {
                  if (*(int *)(pNVar1->name + lVar6 + -0x54) == 2) {
                    local_1fd0 = *(char **)(pNVar1->name + lVar6 + -4);
                  }
                }
                else {
                  iVar3 = __isoc99_sscanf(__s2,"NAXIS%d%c",&j);
                  if (((iVar3 == 1) && (*(int *)((ngph.tok)->name + lVar6 + -0x54) == 3)) &&
                     (j - 1U < 999)) {
                    ngph_size[j - 1U] = (long)*(int *)((ngph.tok)->name + lVar6 + -4);
                  }
                }
              }
            }
          }
        }
        lVar6 = lVar6 + 0xb0;
      }
      if (iVar2 - 2U < 2) {
        ffcrtb(local_2008,(iVar2 != 2) + 1,0,0,(char **)0x0,(char **)0x0,(char **)0x0,(char *)0x0,
               &local_2010);
        if ((local_2010 != 0) || (local_2010 = ngp_append_columns(ff,&ngph,0), local_2010 != 0))
        goto LAB_0017067d;
        local_2010 = ngp_keyword_all_write(&ngph,ff,0);
        if (0 < ngph_size[1] && local_2010 == 0) {
          ffirow(local_2008,0,ngph_size[1],&local_2010);
          ff = local_2008;
        }
LAB_001705ad:
        if ((local_2010 == 0) && (local_1fd0 != (char *)0x0)) {
          local_2010 = ngp_get_extver(local_1fd0,&my_version);
          ff = local_2008;
          lv = (long)my_version;
          ffpky(local_2008,0x29,"EXTVER",&lv,"auto assigned by template parser",&local_2010);
        }
        if ((parent_hn < 1) || (local_2010 != 0)) {
          if (local_2010 != 0) goto LAB_0017067d;
        }
        else {
          ffghdn(ff,&my_hn);
          ffmahd(ff,parent_hn,&tmp0,&local_2010);
          ffgtam(ff,(fitsfile *)0x0,my_hn,&local_2010);
          ffmahd(ff,my_hn,&tmp0,&local_2010);
          if (local_2010 != 0) {
            return local_2010;
          }
        }
      }
      else {
        if (iVar2 == 1) {
          if ((simple_mode & 3U) == 2) {
            ffcrim(local_2008,0x10,0,(long *)0x0,&local_2010);
          }
          ffcrim(local_2008,local_200c,local_1fe4,ngph_size,&local_2010);
          ff = local_2008;
          if (local_2010 == 0) {
            local_2010 = ngp_keyword_all_write(&ngph,local_2008,0);
            goto LAB_001705ad;
          }
        }
        else {
          local_2010 = 0x170;
        }
LAB_0017067d:
        tmp0 = 0;
        ffdhdu(ff,(int *)0x0,&tmp0);
      }
      ngp_hdu_clear(&ngph);
      iVar2 = local_2010;
    }
  }
  return iVar2;
}

Assistant:

int	ngp_read_xtension(fitsfile *ff, int parent_hn, int simple_mode)
 { int		r, exflg, l, my_hn, tmp0, incrementor_index, i, j;
   int		ngph_dim, ngph_bitpix, ngph_node_type, my_version;
   char		incrementor_name[NGP_MAX_STRING], ngph_ctmp;
   char 	*ngph_extname = 0;
   long		ngph_size[NGP_MAX_ARRAY_DIM];
   NGP_HDU	ngph;
   long		lv;

   incrementor_name[0] = 0;			/* signal no keyword+'#' found yet */
   incrementor_index = 0;

   if (NGP_OK != (r = ngp_hdu_init(&ngph))) return(r);

   if (NGP_OK != (r = ngp_read_line(0))) return(r);	/* EOF always means error here */
   switch (NGP_XTENSION_SIMPLE & simple_mode)
     {
       case 0:  if (NGP_TOKEN_XTENSION != ngp_keyidx) return(NGP_TOKEN_NOT_EXPECT);
		break;
       default:	if (NGP_TOKEN_SIMPLE != ngp_keyidx) return(NGP_TOKEN_NOT_EXPECT);
		break;
     }
       	
   if (NGP_OK != (r = ngp_hdu_insert_token(&ngph, &ngp_linkey))) return(r);

   for (;;)
    { if (NGP_OK != (r = ngp_read_line(0))) return(r);	/* EOF always means error here */
      exflg = 0;
      switch (ngp_keyidx)
       { 
	 case NGP_TOKEN_SIMPLE:
	 		r = NGP_TOKEN_NOT_EXPECT;
			break;
	 		                        
	 case NGP_TOKEN_END:
         case NGP_TOKEN_XTENSION:
         case NGP_TOKEN_GROUP:
         		r = ngp_unread_line();	/* WARNING - not break here .... */
         case NGP_TOKEN_EOF:
			exflg = 1;
 			break;

         default:	l = strlen(ngp_linkey.name);
			if ((l >= 2) && (l <= 6))
			  { if ('#' == ngp_linkey.name[l - 1])
			      { if (0 == incrementor_name[0])
			          { memcpy(incrementor_name, ngp_linkey.name, l - 1);
			            incrementor_name[l - 1] = 0;
			          }
			        if (((l - 1) == (int)strlen(incrementor_name)) && (0 == memcmp(incrementor_name, ngp_linkey.name, l - 1)))
			          { incrementor_index++;
			          }
			        snprintf(ngp_linkey.name + l - 1, NGP_MAX_NAME-l+1,"%d", incrementor_index);
			      }
			  }
			r = ngp_hdu_insert_token(&ngph, &ngp_linkey);
 			break;
       }
      if ((NGP_OK != r) || exflg) break;
    }

   if (NGP_OK == r)
     { 				/* we should scan keywords, and calculate HDU's */
				/* structure ourselves .... */

       ngph_node_type = NGP_NODE_INVALID;	/* init variables */
       ngph_bitpix = 0;
       ngph_extname = NULL;
       for (i=0; i<NGP_MAX_ARRAY_DIM; i++) ngph_size[i] = 0;
       ngph_dim = 0;

       for (i=0; i<ngph.tokcnt; i++)
        { if (!strcmp("XTENSION", ngph.tok[i].name))
            { if (NGP_TTYPE_STRING == ngph.tok[i].type)
                { if (!fits_strncasecmp("BINTABLE", ngph.tok[i].value.s,8)) ngph_node_type = NGP_NODE_BTABLE;
                  if (!fits_strncasecmp("TABLE", ngph.tok[i].value.s,5)) ngph_node_type = NGP_NODE_ATABLE;
                  if (!fits_strncasecmp("IMAGE", ngph.tok[i].value.s,5)) ngph_node_type = NGP_NODE_IMAGE;
                }
            }
          else if (!strcmp("SIMPLE", ngph.tok[i].name))
            { if (NGP_TTYPE_BOOL == ngph.tok[i].type)
                { if (ngph.tok[i].value.b) ngph_node_type = NGP_NODE_IMAGE;
                }
            }
          else if (!strcmp("BITPIX", ngph.tok[i].name))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)  ngph_bitpix = ngph.tok[i].value.i;
            }
          else if (!strcmp("NAXIS", ngph.tok[i].name))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)  ngph_dim = ngph.tok[i].value.i;
            }
          else if (!strcmp("EXTNAME", ngph.tok[i].name))	/* assign EXTNAME, I hope struct does not move */
            { if (NGP_TTYPE_STRING == ngph.tok[i].type)  ngph_extname = ngph.tok[i].value.s;
            }
          else if (1 == sscanf(ngph.tok[i].name, "NAXIS%d%c", &j, &ngph_ctmp))
            { if (NGP_TTYPE_INT == ngph.tok[i].type)
		if ((j>=1) && (j <= NGP_MAX_ARRAY_DIM))
		  { ngph_size[j - 1] = ngph.tok[i].value.i;
		  }
            }
        }

       switch (ngph_node_type)
        { case NGP_NODE_IMAGE:
			if (NGP_XTENSION_FIRST == ((NGP_XTENSION_FIRST | NGP_XTENSION_SIMPLE) & simple_mode))
			  { 		/* if caller signals that this is 1st HDU in file */
					/* and it is IMAGE defined with XTENSION, then we */
					/* need create dummy Primary HDU */			  
			    fits_create_img(ff, 16, 0, NULL, &r);
			  }
					/* create image */
			fits_create_img(ff, ngph_bitpix, ngph_dim, ngph_size, &r);

					/* update keywords */
			if (NGP_OK == r)  r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);
			break;

          case NGP_NODE_ATABLE:
          case NGP_NODE_BTABLE:
					/* create table, 0 rows and 0 columns for the moment */
			fits_create_tbl(ff, ((NGP_NODE_ATABLE == ngph_node_type)
					     ? ASCII_TBL : BINARY_TBL),
					0, 0, NULL, NULL, NULL, NULL, &r);
			if (NGP_OK != r) break;

					/* add columns ... */
			r = ngp_append_columns(ff, &ngph, 0);
			if (NGP_OK != r) break;

					/* add remaining keywords */
			r = ngp_keyword_all_write(&ngph, ff, NGP_NON_SYSTEM_ONLY);
			if (NGP_OK != r) break;

					/* if requested add rows */
			if (ngph_size[1] > 0) fits_insert_rows(ff, 0, ngph_size[1], &r);
			break;

	  default:	r = NGP_BAD_ARG;
	  		break;
	}

     }

   if ((NGP_OK == r) && (NULL != ngph_extname))
     { r = ngp_get_extver(ngph_extname, &my_version);	/* write correct ext version number */
       lv = my_version;		/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
       fits_write_key(ff, TLONG, "EXTVER", &lv, "auto assigned by template parser", &r); 
     }

   if (NGP_OK == r)
     { if (parent_hn > 0)
         { fits_get_hdu_num(ff, &my_hn);
           fits_movabs_hdu(ff, parent_hn, &tmp0, &r);	/* link us to parent */
           fits_add_group_member(ff, NULL, my_hn, &r);
           fits_movabs_hdu(ff, my_hn, &tmp0, &r);
           if (NGP_OK != r) return(r);
         }
     }

   if (NGP_OK != r)					/* in case of error - delete hdu */
     { tmp0 = 0;
       fits_delete_hdu(ff, NULL, &tmp0);
     }

   ngp_hdu_clear(&ngph);
   return(r);
 }